

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O2

int __thiscall
IDisk::AddMFMByteToAllTrack(IDisk *this,int side,int track,uint index,uchar byte,int datasize)

{
  MFMTrack *pMVar1;
  ulong uVar2;
  int iVar3;
  undefined3 in_register_00000081;
  uint uVar4;
  bool bVar5;
  
  uVar2 = (ulong)index;
  iVar3 = 0;
  if (0 < datasize) {
    iVar3 = datasize;
  }
  uVar4 = datasize - 1;
  while( true ) {
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) break;
    pMVar1 = this->side_[side].tracks;
    if (pMVar1[track].size <= (uint)uVar2) {
      uVar2 = 0;
    }
    pMVar1[track].bitfield[uVar2] = (CONCAT31(in_register_00000081,byte) >> (uVar4 & 0x1f) & 1) != 0
    ;
    uVar2 = (ulong)((int)uVar2 + 1);
    uVar4 = uVar4 - 1;
  }
  return (uint)uVar2;
}

Assistant:

int IDisk::AddMFMByteToAllTrack(int side, int track, unsigned int index, unsigned char byte, int datasize)
{
   for (int d = 0; d < datasize; d++)
   {
      if (index >= side_[side].tracks[track].size)
      {
         index = 0;
      }
      side_[side].tracks[track].bitfield[index++] = ((byte >> (datasize - 1 - d)) & 0x01);
   }
   return index;
}